

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

bool __thiscall
dg::vr::RelationsAnalyzer::findEqualBorderBucket
          (RelationsAnalyzer *this,ValueRelations *relations,Value *mBorderV,Value *comparedV)

{
  ValueRelations *pVVar1;
  byte *pbVar2;
  Instruction *ptr;
  long lVar3;
  Bucket *lt;
  bool bVar4;
  HandlePtr pBVar5;
  size_t sVar6;
  Function *func;
  vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> *pvVar7;
  VRLocation *pVVar8;
  Handle lt_00;
  pointer pBVar9;
  bool bVar10;
  Argument *arg;
  BorderValue bv;
  Argument *local_80;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_78;
  BorderValue local_60;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_48;
  
  if (((((byte)mBorderV[0x10] < 0x1b) || ((byte)comparedV[0x10] < 0x1b)) ||
      (pBVar5 = ValueRelations::maybeGet(relations,mBorderV), pBVar5 == (HandlePtr)0x0)) ||
     (pBVar5 = ValueRelations::maybeGet(relations,comparedV), pBVar5 == (HandlePtr)0x0)) {
    bVar10 = false;
  }
  else {
    getFroms(&local_48,relations,mBorderV);
    getFroms(&local_78,relations,comparedV);
    if ((((long)local_48.
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x10) &&
        ((long)local_78.
               super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)local_78.
               super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl
               .super__Vector_impl_data._M_start == 0x10)) &&
       (sVar6 = limitingBorder(relations,
                               *local_48.
                                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                ._M_impl.super__Vector_impl_data._M_start),
       sVar6 != 0xffffffffffffffff)) {
      pBVar5 = ValueRelations::getHandle
                         (relations,
                          *local_78.
                           super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      local_80 = getArgument(relations,pBVar5);
      bVar10 = local_80 != (Argument *)0x0;
      if (bVar10) {
        ptr = (Instruction *)
              *local_78.
               super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl
               .super__Vector_impl_data._M_start;
        func = (Function *)llvm::Instruction::getFunction();
        StructureAnalyzer::getBorderValueFor
                  (&local_60,*(StructureAnalyzer **)(this + 0x40),func,sVar6);
        pvVar7 = StructureAnalyzer::getBorderValuesFor(*(StructureAnalyzer **)(this + 0x40),func);
        for (pBVar9 = (pvVar7->
                      super__Vector_base<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            pBVar9 != (pvVar7->
                      super__Vector_base<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>)
                      ._M_impl.super__Vector_impl_data._M_finish; pBVar9 = pBVar9 + 1) {
          if ((pBVar9->from == local_80) && (pBVar9->stored == local_60.stored)) {
            pVVar8 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),ptr);
            lVar3 = *(long *)(*(long *)((long)(((pVVar8->successors).
                                                super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                              super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>
                                              ._M_t + 8) + 0x138);
            pVVar1 = (ValueRelations *)(lVar3 + 8);
            pBVar5 = ValueRelations::maybeGet
                               (pVVar1,local_78.
                                       super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]);
            lt = ((pBVar5->relatedBuckets)._M_elems[10].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_data;
            pBVar5 = ValueRelations::getBorderH(pVVar1,pBVar9->id);
            bVar4 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                              ((RelationsGraph<dg::vr::ValueRelations> *)pVVar1,lt,SLE,pBVar5,
                               (Relations *)0x0);
            pbVar2 = (byte *)(lVar3 + 0xe8);
            *pbVar2 = *pbVar2 | bVar4;
            goto LAB_0011eb94;
          }
        }
        sVar6 = StructureAnalyzer::addBorderValue
                          (*(StructureAnalyzer **)(this + 0x40),func,local_80,local_60.stored);
        pVVar8 = VRCodeGraph::getEntryLocation(*(VRCodeGraph **)(this + 0x38),func);
        pVVar1 = &pVVar8->relations;
        lt_00 = ValueRelations::newBorderBucket(pVVar1,sVar6);
        ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>(pVVar1,lt_00,PT,&local_60.stored);
        ValueRelations::set<dg::vr::Bucket,llvm::Argument_const*>(pVVar1,lt_00,SGE,&local_80);
      }
    }
    else {
      bVar10 = false;
    }
LAB_0011eb94:
    if (local_78.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar10;
}

Assistant:

void RelationsAnalyzer::inferShiftInLoop(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, ValueRelations &newGraph,
        Handle placeholder) {
    const ValueRelations &predGraph = changeLocations[0]->relations;
    HandlePtr from = getCorrespondingByContent(predGraph, froms);
    assert(from);

    const auto &initial = predGraph.getEqual(predGraph.getPointedTo(*from));
    if (initial.empty())
        return;

    auto shift = getShift(changeLocations, froms);
    if (shift == Shift::UNKNOWN)
        return;

    if (shift == Shift::INC || shift == Shift::DEC)
        inferFromNonEquality(*changeLocations[0]->getSuccLocation(0), froms,
                             shift, placeholder);

    Relations::Type rel =
            shift == Shift::EQ
                    ? Relations::EQ
                    : (shift == Shift::INC ? Relations::SLE : Relations::SGE);

    // placeholder must be first so that if setting EQ, its bucket is
    // preserved
    newGraph.set(placeholder, Relations::inverted(rel), *initial.begin());
}